

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O1

FT_Error TT_Get_MM_Var(TT_Face face,FT_MM_Var **master)

{
  GX_Blend pGVar1;
  void *pvVar2;
  char cVar3;
  FT_UShort FVar4;
  FT_Error FVar5;
  FT_MM_Var *pFVar6;
  FT_Var_Axis *pFVar7;
  GX_Blend pGVar8;
  FT_Fixed *pFVar9;
  FT_ULong FVar10;
  int iVar11;
  FT_Var_Named_Style *pFVar12;
  FT_String *pFVar13;
  FT_Fixed *pFVar14;
  ulong uVar15;
  long lVar16;
  FT_Offset size;
  FT_Memory memory;
  FT_Var_Named_Style *pFVar17;
  ulong uVar18;
  char *pcVar19;
  uint uVar20;
  FT_UInt FVar21;
  FT_Stream pFVar22;
  uint uVar23;
  FT_UInt num_coords;
  bool bVar24;
  FT_Error error;
  FT_Int dummy2;
  GX_FVar_Head fvar_head;
  FT_ULong table_len;
  GX_FVar_Axis axis_rec;
  uint local_f0;
  byte local_e9;
  FT_Var_Named_Style *local_e8;
  FT_MM_Var *local_e0;
  ulong local_d8;
  FT_Stream local_d0;
  uint local_c8;
  undefined1 local_c4 [4];
  ulong local_c0;
  FT_Memory local_b8;
  long local_b0;
  ulong local_a8;
  FT_MM_Var *local_a0;
  long local_98;
  undefined1 local_90 [8];
  ushort local_88;
  ushort local_86;
  ushort local_82;
  ushort local_80;
  FT_ULong local_78;
  FT_ULong local_70;
  FT_Fixed *local_68;
  ulong local_60;
  FT_ULong local_58;
  FT_Fixed local_50;
  FT_Fixed local_48;
  FT_Fixed local_40;
  undefined2 local_38;
  ushort local_36;
  
  memory = (face->root).memory;
  pFVar22 = (face->root).stream;
  local_f0 = 0;
  pGVar1 = face->blend;
  if (pGVar1 == (GX_Blend)0x0) {
    local_f0 = (*face->goto_table)(face,0x67766172,pFVar22,&local_78);
    if ((local_f0 != 0) &&
       (local_f0 = (*face->goto_table)(face,0x43464632,pFVar22,&local_78), local_f0 != 0)) {
      return local_f0;
    }
    local_f0 = (*face->goto_table)(face,0x66766172,pFVar22,&local_78);
    if (local_f0 != 0) {
      return local_f0;
    }
    local_e8 = (FT_Var_Named_Style *)FT_Stream_Pos(pFVar22);
    local_f0 = FT_Stream_ReadFields(pFVar22,TT_Get_MM_Var::fvar_fields,local_90);
    if (local_f0 != 0) {
      return local_f0;
    }
    local_d8 = CONCAT44(local_d8._4_4_,(uint)local_80);
    local_c0 = (ulong)local_86;
    pGVar8 = (GX_Blend)ft_mem_alloc(memory,0x90,(FT_Error *)&local_f0);
    face->blend = pGVar8;
    if (local_f0 != 0) {
      return local_f0;
    }
    bVar24 = (int)local_c0 * 4 + 6 != (int)local_d8;
    num_coords = (FT_UInt)local_86;
  }
  else {
    num_coords = pGVar1->num_axis;
    bVar24 = true;
    local_e8 = (FT_Var_Named_Style *)0x0;
  }
  uVar23 = (uint)(face->root).style_flags;
  uVar20 = uVar23 >> 0x10;
  local_d8 = (ulong)num_coords;
  uVar18 = local_d8 * 2 + 7 & 0xfffffffffffffff8;
  local_c0 = (ulong)(uVar20 << 4);
  local_98 = (ulong)(uVar20 * num_coords) * 8;
  lVar16 = local_d8 * 0x30;
  local_a0 = (FT_MM_Var *)master;
  if (pGVar1 == (GX_Blend)0x0) {
    size = local_98 + (ulong)(num_coords * 5) + lVar16 + local_c0 + uVar18 + 0x20;
    face->blend->mmvar_len = size;
    local_e9 = bVar24;
    local_c8 = uVar20;
    local_b8 = memory;
    local_b0 = lVar16;
    local_a8 = uVar18;
    local_e0 = (FT_MM_Var *)ft_mem_alloc(memory,size,(FT_Error *)&local_f0);
    if (local_f0 != 0) {
      return local_f0;
    }
    face->blend->mmvar = local_e0;
    local_e0->num_axis = num_coords;
    local_e0->num_designs = 0xffffffff;
    local_e0->num_namedstyles = local_c8;
    pFVar7 = (FT_Var_Axis *)((long)&local_e0[1].num_axis + local_a8);
    local_e0->axis = pFVar7;
    pFVar12 = (FT_Var_Named_Style *)((long)&pFVar7->name + local_b0);
    local_e0->namedstyle = pFVar12;
    if (0xffff < uVar23) {
      uVar18 = (ulong)(local_c8 + (local_c8 == 0));
      pFVar9 = (FT_Fixed *)((long)&local_e0[1].num_axis + local_b0 + local_c0 + local_a8);
      pFVar17 = pFVar12;
      do {
        pFVar17->coords = pFVar9;
        pFVar17 = pFVar17 + 1;
        pFVar9 = pFVar9 + local_d8;
        uVar18 = uVar18 - 1;
      } while (uVar18 != 0);
    }
    if (num_coords != 0) {
      pFVar13 = (FT_String *)((long)&pFVar12->coords + local_98 + local_c0);
      uVar18 = local_d8;
      do {
        pFVar7->name = pFVar13;
        pFVar13 = pFVar13 + 5;
        pFVar7 = pFVar7 + 1;
        uVar18 = uVar18 - 1;
      } while (uVar18 != 0);
    }
    local_d0 = pFVar22;
    FVar5 = FT_Stream_Seek(pFVar22,(long)&local_e8->coords + (ulong)local_88);
    if (FVar5 != 0) {
      return FVar5;
    }
    local_f0 = 0;
    if (num_coords != 0) {
      pFVar6 = local_e0 + 1;
      pFVar7 = local_e0->axis;
      local_f0 = 0;
      uVar23 = num_coords;
      do {
        local_f0 = FT_Stream_ReadFields(local_d0,TT_Get_MM_Var::fvaraxis_fields,&local_58);
        uVar18 = (ulong)local_f0;
        iVar11 = 6;
        if (local_f0 == 0) {
          pFVar7->tag = local_58;
          pFVar7->minimum = local_50;
          pFVar7->def = local_48;
          pFVar7->maximum = local_40;
          pFVar7->strid = (uint)local_36;
          *pFVar7->name = (FT_String)(local_58 >> 0x18);
          pFVar7->name[1] = *(FT_String *)((long)&pFVar7->tag + 2);
          pFVar7->name[2] = *(FT_String *)((long)&pFVar7->tag + 1);
          pFVar7->name[3] = (FT_String)pFVar7->tag;
          pFVar7->name[4] = '\0';
          *(undefined2 *)&pFVar6->num_axis = local_38;
          uVar18 = pFVar7->def;
          if (((long)uVar18 < pFVar7->minimum) || (pFVar7->maximum < (long)uVar18)) {
            pFVar7->minimum = uVar18;
            pFVar7->maximum = uVar18;
          }
          pFVar7 = pFVar7 + 1;
          pFVar6 = (FT_MM_Var *)((long)&pFVar6->num_axis + 2);
          iVar11 = 0;
        }
        if (iVar11 != 0) {
          if (iVar11 == 6) {
            return local_f0;
          }
          return (FT_Error)uVar18;
        }
        uVar23 = uVar23 - 1;
      } while (uVar23 != 0);
    }
    pFVar9 = (FT_Fixed *)
             ft_mem_realloc(local_b8,8,0,(ulong)(uVar20 * num_coords),(void *)0x0,
                            (FT_Error *)&local_f0);
    pFVar22 = local_d0;
    pGVar1 = face->blend;
    pGVar1->normalized_stylecoords = pFVar9;
    if (local_f0 != 0) {
      return local_f0;
    }
    if ((local_82 != 0) && (pGVar1->avar_loaded == '\0')) {
      FVar10 = FT_Stream_Pos(local_d0);
      ft_var_load_avar(face);
      local_f0 = FT_Stream_Seek(pFVar22,FVar10);
      if (local_f0 != 0) {
        return local_f0;
      }
    }
    uVar18 = local_d8;
    iVar11 = (int)local_d8;
    if (local_82 != 0) {
      pFVar9 = face->blend->normalized_stylecoords;
      local_e8 = local_e0->namedstyle;
      local_70 = (ulong)((uint)(local_e9 ^ 1) * 2) + local_d8 * 4 + 4;
      uVar15 = 0;
      do {
        local_60 = uVar15;
        local_f0 = FT_Stream_EnterFrame(pFVar22,local_70);
        if (local_f0 != 0) {
          return local_f0;
        }
        local_68 = pFVar9;
        FVar4 = FT_Stream_GetUShort(pFVar22);
        local_e8->strid = (uint)FVar4;
        FT_Stream_GetUShort(pFVar22);
        if (num_coords != 0) {
          pFVar9 = local_e8->coords;
          lVar16 = 0;
          do {
            FVar10 = FT_Stream_GetULong(pFVar22);
            pFVar9[lVar16] = FVar10;
            lVar16 = lVar16 + 1;
          } while (iVar11 != (int)lVar16);
        }
        uVar15 = local_60;
        pFVar9 = local_68;
        uVar23 = 0xffff;
        if (local_e9 == 0) {
          FVar4 = FT_Stream_GetUShort(pFVar22);
          uVar23 = (uint)FVar4;
        }
        pFVar12 = local_e8;
        local_e8->psid = uVar23;
        ft_var_to_normalized(face,num_coords,local_e8->coords,pFVar9);
        pFVar9 = pFVar9 + uVar18;
        FT_Stream_ExitFrame(local_d0);
        uVar23 = (int)uVar15 + 1;
        uVar15 = (ulong)uVar23;
        local_e8 = pFVar12 + 1;
        pFVar22 = local_d0;
      } while (uVar23 < local_82);
    }
    if (local_c8 != local_82) {
      pvVar2 = face->sfnt;
      FVar21 = 0x11;
      cVar3 = (**(code **)((long)pvVar2 + 0xf0))(face,0x11,&local_58);
      if (cVar3 == '\0') {
        cVar3 = (**(code **)((long)pvVar2 + 0xf0))(face,2,&local_58,local_c4);
        bVar24 = cVar3 == '\0';
        FVar21 = -(uint)bVar24 | 2;
      }
      else {
        bVar24 = false;
      }
      if ((!bVar24) &&
         (cVar3 = (**(code **)((long)pvVar2 + 0xf0))(face,6,&local_58,local_c4), cVar3 != '\0')) {
        pFVar12 = local_e0->namedstyle;
        uVar18 = (ulong)local_82;
        pFVar12[uVar18].strid = FVar21;
        pFVar12[uVar18].psid = 6;
        if (num_coords != 0) {
          pFVar9 = pFVar12[uVar18].coords;
          pFVar14 = &local_e0->axis->def;
          lVar16 = 0;
          do {
            pFVar9[lVar16] = *pFVar14;
            lVar16 = lVar16 + 1;
            pFVar14 = pFVar14 + 6;
          } while (iVar11 != (int)lVar16);
        }
      }
    }
    ft_var_load_mvar(face);
    memory = local_b8;
    uVar18 = local_a8;
    lVar16 = local_b0;
  }
  if (local_a0 != (FT_MM_Var *)0x0) {
    pFVar6 = (FT_MM_Var *)ft_mem_alloc(memory,face->blend->mmvar_len,(FT_Error *)&local_f0);
    iVar11 = 6;
    if (local_f0 == 0) {
      memcpy(pFVar6,face->blend->mmvar,face->blend->mmvar_len);
      pFVar7 = (FT_Var_Axis *)((long)&pFVar6[1].num_axis + uVar18);
      pFVar6->axis = pFVar7;
      pFVar12 = (FT_Var_Named_Style *)((long)&pFVar6[1].num_axis + lVar16 + uVar18);
      pFVar6->namedstyle = pFVar12;
      uVar15 = (ulong)pFVar6->num_namedstyles;
      if (uVar15 != 0) {
        pFVar9 = (FT_Fixed *)((long)&pFVar6[1].num_axis + lVar16 + local_c0 + uVar18);
        pFVar17 = pFVar12;
        do {
          pFVar17->coords = pFVar9;
          pFVar17 = pFVar17 + 1;
          pFVar9 = pFVar9 + local_d8;
          uVar15 = uVar15 - 1;
        } while (uVar15 != 0);
      }
      if (num_coords != 0) {
        pFVar13 = (FT_String *)((long)&pFVar12->coords + local_98 + local_c0);
        do {
          pFVar7->name = pFVar13;
          FVar10 = pFVar7->tag;
          if ((long)FVar10 < 0x77647468) {
            if (FVar10 == 0x6f70737a) {
              pcVar19 = "OpticalSize";
              goto LAB_0016d13d;
            }
            if (FVar10 == 0x736c6e74) {
              pcVar19 = "Slant";
              goto LAB_0016d13d;
            }
          }
          else {
            pcVar19 = "Weight";
            if (FVar10 != 0x77676874) {
              if (FVar10 != 0x77647468) goto LAB_0016d140;
              pcVar19 = "Width";
            }
LAB_0016d13d:
            pFVar7->name = pcVar19;
          }
LAB_0016d140:
          pFVar13 = pFVar13 + 5;
          pFVar7 = pFVar7 + 1;
          num_coords = num_coords - 1;
        } while (num_coords != 0);
      }
      *(FT_MM_Var **)local_a0 = pFVar6;
      iVar11 = 0;
      pFVar6 = local_a0;
    }
    if ((iVar11 != 6) && (iVar11 != 0)) {
      return (FT_Error)pFVar6;
    }
  }
  return local_f0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  TT_Get_MM_Var( TT_Face      face,
                 FT_MM_Var*  *master )
  {
    FT_Stream            stream     = face->root.stream;
    FT_Memory            memory     = face->root.memory;
    FT_ULong             table_len;
    FT_Error             error      = FT_Err_Ok;
    FT_ULong             fvar_start = 0;
    FT_UInt              i, j;
    FT_MM_Var*           mmvar = NULL;
    FT_Fixed*            next_coords;
    FT_Fixed*            nsc;
    FT_String*           next_name;
    FT_Var_Axis*         a;
    FT_Fixed*            c;
    FT_Var_Named_Style*  ns;
    GX_FVar_Head         fvar_head;
    FT_Bool              usePsName  = 0;
    FT_UInt              num_instances;
    FT_UInt              num_axes;
    FT_UShort*           axis_flags;

    FT_Offset  mmvar_size;
    FT_Offset  axis_flags_size;
    FT_Offset  axis_size;
    FT_Offset  namedstyle_size;
    FT_Offset  next_coords_size;
    FT_Offset  next_name_size;

    FT_Bool  need_init;

    static const FT_Frame_Field  fvar_fields[] =
    {

#undef  FT_STRUCTURE
#define FT_STRUCTURE  GX_FVar_Head

      FT_FRAME_START( 16 ),
        FT_FRAME_LONG      ( version ),
        FT_FRAME_USHORT    ( offsetToData ),
        FT_FRAME_SKIP_SHORT,
        FT_FRAME_USHORT    ( axisCount ),
        FT_FRAME_USHORT    ( axisSize ),
        FT_FRAME_USHORT    ( instanceCount ),
        FT_FRAME_USHORT    ( instanceSize ),
      FT_FRAME_END
    };

    static const FT_Frame_Field  fvaraxis_fields[] =
    {

#undef  FT_STRUCTURE
#define FT_STRUCTURE  GX_FVar_Axis

      FT_FRAME_START( 20 ),
        FT_FRAME_ULONG ( axisTag ),
        FT_FRAME_LONG  ( minValue ),
        FT_FRAME_LONG  ( defaultValue ),
        FT_FRAME_LONG  ( maxValue ),
        FT_FRAME_USHORT( flags ),
        FT_FRAME_USHORT( nameID ),
      FT_FRAME_END
    };


    /* read the font data and set up the internal representation */
    /* if not already done                                       */

    need_init = !face->blend;

    if ( need_init )
    {
      FT_TRACE2(( "FVAR " ));

      /* both `fvar' and `gvar' must be present */
      if ( FT_SET_ERROR( face->goto_table( face, TTAG_gvar,
                                           stream, &table_len ) ) )
      {
        /* CFF2 is an alternate to gvar here */
        if ( FT_SET_ERROR( face->goto_table( face, TTAG_CFF2,
                                             stream, &table_len ) ) )
        {
          FT_TRACE1(( "\n"
                      "TT_Get_MM_Var: `gvar' or `CFF2' table is missing\n" ));
          goto Exit;
        }
      }

      if ( FT_SET_ERROR( face->goto_table( face, TTAG_fvar,
                                           stream, &table_len ) ) )
      {
        FT_TRACE1(( "is missing\n" ));
        goto Exit;
      }

      fvar_start = FT_STREAM_POS( );

      /* the validity of the `fvar' header data was already checked */
      /* in function `sfnt_init_face'                               */
      if ( FT_STREAM_READ_FIELDS( fvar_fields, &fvar_head ) )
        goto Exit;

      usePsName = FT_BOOL( fvar_head.instanceSize ==
                           6 + 4 * fvar_head.axisCount );

      FT_TRACE2(( "loaded\n" ));

      FT_TRACE5(( "number of GX style axes: %d\n", fvar_head.axisCount ));

      if ( FT_NEW( face->blend ) )
        goto Exit;

      num_axes = fvar_head.axisCount;
    }
    else
      num_axes = face->blend->num_axis;

    /* `num_instances' holds the number of all named instances, */
    /* including the default instance which might be missing    */
    /* in fvar's table of named instances                       */
    num_instances = (FT_UInt)face->root.style_flags >> 16;

    /* prepare storage area for MM data; this cannot overflow   */
    /* 32-bit arithmetic because of the size limits used in the */
    /* `fvar' table validity check in `sfnt_init_face'          */

    /* the various `*_size' variables, which we also use as     */
    /* offsets into the `mmlen' array, must be multiples of the */
    /* pointer size (except the last one); without such an      */
    /* alignment there might be runtime errors due to           */
    /* misaligned addresses                                     */
#undef  ALIGN_SIZE
#define ALIGN_SIZE( n ) \
          ( ( (n) + sizeof (void*) - 1 ) & ~( sizeof (void*) - 1 ) )

    mmvar_size       = ALIGN_SIZE( sizeof ( FT_MM_Var ) );
    axis_flags_size  = ALIGN_SIZE( num_axes *
                                   sizeof ( FT_UShort ) );
    axis_size        = ALIGN_SIZE( num_axes *
                                   sizeof ( FT_Var_Axis ) );
    namedstyle_size  = ALIGN_SIZE( num_instances *
                                   sizeof ( FT_Var_Named_Style ) );
    next_coords_size = ALIGN_SIZE( num_instances *
                                   num_axes *
                                   sizeof ( FT_Fixed ) );
    next_name_size   = num_axes * 5;

    if ( need_init )
    {
      face->blend->mmvar_len = mmvar_size       +
                               axis_flags_size  +
                               axis_size        +
                               namedstyle_size  +
                               next_coords_size +
                               next_name_size;

      if ( FT_ALLOC( mmvar, face->blend->mmvar_len ) )
        goto Exit;
      face->blend->mmvar = mmvar;

      /* set up pointers and offsets into the `mmvar' array; */
      /* the data gets filled in later on                    */

      mmvar->num_axis =
        num_axes;
      mmvar->num_designs =
        ~0U;                   /* meaningless in this context; each glyph */
                               /* may have a different number of designs  */
                               /* (or tuples, as called by Apple)         */
      mmvar->num_namedstyles =
        num_instances;

      /* alas, no public field in `FT_Var_Axis' for axis flags */
      axis_flags =
        (FT_UShort*)( (char*)mmvar + mmvar_size );
      mmvar->axis =
        (FT_Var_Axis*)( (char*)axis_flags + axis_flags_size );
      mmvar->namedstyle =
        (FT_Var_Named_Style*)( (char*)mmvar->axis + axis_size );

      next_coords = (FT_Fixed*)( (char*)mmvar->namedstyle +
                                 namedstyle_size );
      for ( i = 0; i < num_instances; i++ )
      {
        mmvar->namedstyle[i].coords  = next_coords;
        next_coords                 += num_axes;
      }

      next_name = (FT_String*)( (char*)mmvar->namedstyle +
                                namedstyle_size + next_coords_size );
      for ( i = 0; i < num_axes; i++ )
      {
        mmvar->axis[i].name  = next_name;
        next_name           += 5;
      }

      /* now fill in the data */

      if ( FT_STREAM_SEEK( fvar_start + fvar_head.offsetToData ) )
        goto Exit;

      a = mmvar->axis;
      for ( i = 0; i < num_axes; i++ )
      {
        GX_FVar_Axis  axis_rec;


        if ( FT_STREAM_READ_FIELDS( fvaraxis_fields, &axis_rec ) )
          goto Exit;
        a->tag     = axis_rec.axisTag;
        a->minimum = axis_rec.minValue;
        a->def     = axis_rec.defaultValue;
        a->maximum = axis_rec.maxValue;
        a->strid   = axis_rec.nameID;

        a->name[0] = (FT_String)(   a->tag >> 24 );
        a->name[1] = (FT_String)( ( a->tag >> 16 ) & 0xFF );
        a->name[2] = (FT_String)( ( a->tag >>  8 ) & 0xFF );
        a->name[3] = (FT_String)( ( a->tag       ) & 0xFF );
        a->name[4] = '\0';

        *axis_flags = axis_rec.flags;

        if ( a->minimum > a->def ||
             a->def > a->maximum )
        {
          FT_TRACE2(( "TT_Get_MM_Var:"
                      " invalid \"%s\" axis record; disabling\n",
                      a->name ));

          a->minimum = a->def;
          a->maximum = a->def;
        }

        FT_TRACE5(( "  \"%s\":"
                    " minimum=%.5f, default=%.5f, maximum=%.5f,"
                    " flags=0x%04X\n",
                    a->name,
                    a->minimum / 65536.0,
                    a->def / 65536.0,
                    a->maximum / 65536.0,
                    *axis_flags ));

        a++;
        axis_flags++;
      }

      FT_TRACE5(( "\n" ));

      /* named instance coordinates are stored as design coordinates; */
      /* we have to convert them to normalized coordinates also       */
      if ( FT_NEW_ARRAY( face->blend->normalized_stylecoords,
                         num_axes * num_instances ) )
        goto Exit;

      if ( fvar_head.instanceCount && !face->blend->avar_loaded )
      {
        FT_ULong  offset = FT_STREAM_POS();


        ft_var_load_avar( face );

        if ( FT_STREAM_SEEK( offset ) )
          goto Exit;
      }

      ns  = mmvar->namedstyle;
      nsc = face->blend->normalized_stylecoords;
      for ( i = 0; i < fvar_head.instanceCount; i++, ns++ )
      {
        /* PostScript names add 2 bytes to the instance record size */
        if ( FT_FRAME_ENTER( ( usePsName ? 6L : 4L ) +
                             4L * num_axes ) )
          goto Exit;

        ns->strid       =    FT_GET_USHORT();
        (void) /* flags = */ FT_GET_USHORT();

        c = ns->coords;
        for ( j = 0; j < num_axes; j++, c++ )
          *c = FT_GET_LONG();

        /* valid psid values are 6, [256;32767], and 0xFFFF */
        if ( usePsName )
          ns->psid = FT_GET_USHORT();
        else
          ns->psid = 0xFFFF;

        ft_var_to_normalized( face, num_axes, ns->coords, nsc );
        nsc += num_axes;

        FT_FRAME_EXIT();
      }

      if ( num_instances != fvar_head.instanceCount )
      {
        SFNT_Service  sfnt = (SFNT_Service)face->sfnt;

        FT_Int   found, dummy1, dummy2;
        FT_UInt  strid = ~0U;


        /* the default instance is missing in array the   */
        /* of named instances; try to synthesize an entry */
        found = sfnt->get_name_id( face,
                                   TT_NAME_ID_TYPOGRAPHIC_SUBFAMILY,
                                   &dummy1,
                                   &dummy2 );
        if ( found )
          strid = TT_NAME_ID_TYPOGRAPHIC_SUBFAMILY;
        else
        {
          found = sfnt->get_name_id( face,
                                     TT_NAME_ID_FONT_SUBFAMILY,
                                     &dummy1,
                                     &dummy2 );
          if ( found )
            strid = TT_NAME_ID_FONT_SUBFAMILY;
        }

        if ( found )
        {
          found = sfnt->get_name_id( face,
                                     TT_NAME_ID_PS_NAME,
                                     &dummy1,
                                     &dummy2 );
          if ( found )
          {
            FT_TRACE5(( "TT_Get_MM_Var:"
                        " Adding default instance to named instances\n" ));

            ns = &mmvar->namedstyle[fvar_head.instanceCount];

            ns->strid = strid;
            ns->psid  = TT_NAME_ID_PS_NAME;

            a = mmvar->axis;
            c = ns->coords;
            for ( j = 0; j < num_axes; j++, a++, c++ )
              *c = a->def;
          }
        }
      }

      ft_var_load_mvar( face );
    }

    /* fill the output array if requested */

    if ( master )
    {
      FT_UInt  n;


      if ( FT_ALLOC( mmvar, face->blend->mmvar_len ) )
        goto Exit;
      FT_MEM_COPY( mmvar, face->blend->mmvar, face->blend->mmvar_len );

      axis_flags =
        (FT_UShort*)( (char*)mmvar + mmvar_size );
      mmvar->axis =
        (FT_Var_Axis*)( (char*)axis_flags + axis_flags_size );
      mmvar->namedstyle =
        (FT_Var_Named_Style*)( (char*)mmvar->axis+ axis_size );

      next_coords = (FT_Fixed*)( (char*)mmvar->namedstyle +
                                 namedstyle_size );
      for ( n = 0; n < mmvar->num_namedstyles; n++ )
      {
        mmvar->namedstyle[n].coords  = next_coords;
        next_coords                 += num_axes;
      }

      a         = mmvar->axis;
      next_name = (FT_String*)( (char*)mmvar->namedstyle +
                                namedstyle_size + next_coords_size );
      for ( n = 0; n < num_axes; n++ )
      {
        a->name = next_name;

        /* standard PostScript names for some standard apple tags */
        if ( a->tag == TTAG_wght )
          a->name = (char*)"Weight";
        else if ( a->tag == TTAG_wdth )
          a->name = (char*)"Width";
        else if ( a->tag == TTAG_opsz )
          a->name = (char*)"OpticalSize";
        else if ( a->tag == TTAG_slnt )
          a->name = (char*)"Slant";

        next_name += 5;
        a++;
      }

      *master = mmvar;
    }

  Exit:
    return error;
  }